

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quoting.cpp
# Opt level: O1

pair<std::shared_ptr<SchemeObject>,_bool> *
do_quote(pair<std::shared_ptr<SchemeObject>,_bool> *__return_storage_ptr__,shared_ptr<ASTNode> *node
        ,Context *context,int quasi_level)

{
  ASTNode *this;
  long lVar1;
  _List_node_base *p_Var2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  _Node *p_Var11;
  element_type *peVar12;
  runtime_error *prVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  _List_node_base *p_Var14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  ExecutionResult *pEVar16;
  string head;
  bool dotted;
  list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> to_insert;
  shared_ptr<SchemePair> lst;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  _Head_base<0UL,_TailContext_*,_false> local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  ExecutionResult local_a0;
  shared_ptr<SchemeObject> local_80;
  int local_6c;
  pair<std::shared_ptr<SchemeObject>,_bool> *local_68;
  shared_ptr<SchemePair> local_60;
  shared_ptr<ASTNode> local_50;
  shared_ptr<ASTNode> *local_40;
  Context *local_38;
  
  this = (node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (this->type - INT < 5) {
    ASTNode::evaluate((ExecutionResult *)local_d8,this,context);
    ExecutionResult::force_value(&local_a0);
    peVar3 = local_a0.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_a0._0_8_;
    (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a0.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar3;
    local_a0._0_8_ = (ExecutionResult *)0x0;
    __return_storage_ptr__->second = false;
    if ((_Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>)local_c0._M_head_impl !=
        (TailContext *)0x0) {
      std::default_delete<TailContext>::operator()
                ((default_delete<TailContext> *)&local_c0,local_c0._M_head_impl);
    }
    local_c0._M_head_impl = (TailContext *)0x0;
    local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_c8._1_7_,local_c8[0]);
    goto LAB_001372d0;
  }
  if (this->type == NAME) {
    local_d8._0_8_ = (SchemeSymbol *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<SchemeSymbol,std::allocator<SchemeSymbol>,std::__cxx11::string&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8),
               (SchemeSymbol **)local_d8,(allocator<SchemeSymbol> *)&local_a0,&this->value);
    uVar7 = local_d8._8_8_;
    uVar6 = local_d8._0_8_;
    local_d8._0_8_ = (SchemeSymbol *)0x0;
    local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar6;
      (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      __return_storage_ptr__->second = false;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(uVar7 + 8) = *(_Atomic_word *)(uVar7 + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(uVar7 + 8) = *(_Atomic_word *)(uVar7 + 8) + 1;
      }
      (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar6;
      (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
      __return_storage_ptr__->second = false;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
        local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
      }
    }
    goto LAB_001372d0;
  }
  std::dynamic_pointer_cast<SchemePair,SchemeObject>(&local_80);
  if (((0 < quasi_level) &&
      (peVar12 = (node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
      (peVar12->list).
      super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>._M_impl
      ._M_node._M_size != 0)) &&
     (lVar10 = (long)(peVar12->list).
                     super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next, **(int **)(lVar10 + 0x10) == 1)
     ) {
    lVar10 = *(long *)(lVar10 + 0x10);
    lVar1 = *(long *)(lVar10 + 8);
    local_d8._0_8_ = (SchemeSymbol *)local_c8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d8,lVar1,*(long *)(lVar10 + 0x10) + lVar1);
    iVar8 = std::__cxx11::string::compare(local_d8);
    if (iVar8 == 0) {
      if (quasi_level != 1) {
LAB_001374e8:
        quasi_level = quasi_level + -1;
        goto LAB_001374ea;
      }
      peVar12 = (node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar12->list).
          super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>.
          _M_impl._M_node._M_size != 2) {
        prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar13,"unquote: one argument required");
LAB_00137921:
        *(undefined ***)prVar13 = &PTR__runtime_error_0016b300;
        __cxa_throw(prVar13,&eval_error::typeinfo,std::runtime_error::~runtime_error);
      }
      ASTNode::evaluate(&local_a0,
                        (ASTNode *)
                        (*(_List_node_base **)
                          ((long)&(peVar12->list).
                                  super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                                  ._M_impl._M_node.super__List_node_base + 8))[1]._M_next,context);
      ExecutionResult::force_value((ExecutionResult *)&local_b0);
      (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_b0._M_allocated_capacity;
      (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_;
      __return_storage_ptr__->second = false;
LAB_001374d7:
      local_b0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_b0._M_allocated_capacity = 0;
      bVar5 = false;
      ExecutionResult::~ExecutionResult(&local_a0);
      quasi_level = 1;
    }
    else {
      iVar8 = std::__cxx11::string::compare(local_d8);
      if (iVar8 == 0) {
        if (quasi_level != 1) goto LAB_001374e8;
        peVar12 = (node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if ((peVar12->list).
            super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>.
            _M_impl._M_node._M_size != 2) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar13,"unquote-splicing: one argument required");
          goto LAB_00137921;
        }
        ASTNode::evaluate(&local_a0,
                          (ASTNode *)
                          (*(_List_node_base **)
                            ((long)&(peVar12->list).
                                    super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>
                                    ._M_impl._M_node.super__List_node_base + 8))[1]._M_next,context)
        ;
        ExecutionResult::force_value((ExecutionResult *)&local_b0);
        (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)local_b0._M_allocated_capacity;
        (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_;
        __return_storage_ptr__->second = true;
        goto LAB_001374d7;
      }
      iVar8 = std::__cxx11::string::compare(local_d8);
      quasi_level = quasi_level + (uint)(iVar8 == 0);
LAB_001374ea:
      bVar5 = true;
    }
    if ((SchemeSymbol *)local_d8._0_8_ != (SchemeSymbol *)local_c8) {
      operator_delete((void *)local_d8._0_8_,CONCAT71(local_c8._1_7_,local_c8[0]) + 1);
    }
    if (!bVar5) goto LAB_001372d0;
  }
  local_b0._M_allocated_capacity = local_b0._M_allocated_capacity & 0xffffffffffffff00;
  peVar12 = (node->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var14 = (_List_node_base *)&peVar12->list;
  local_6c = quasi_level;
  local_68 = __return_storage_ptr__;
  local_40 = node;
  local_38 = context;
  if (p_Var14 !=
      (peVar12->list).
      super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>._M_impl
      ._M_node.super__List_node_base._M_next) {
    iVar8 = 0;
    do {
      local_50.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var14->_M_prev[1]._M_next;
      local_50.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var14->_M_prev[1]._M_prev;
      if (local_50.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_50.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_50.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_50.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_50.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      do_quote((pair<std::shared_ptr<SchemeObject>,_bool> *)local_d8,&local_50,local_38,local_6c);
      if (local_50.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_c8[0] == true) {
        local_a0.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_a0;
        local_a0.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_a0._0_8_ = &local_a0;
        while ((element_type *)local_d8._0_8_ !=
               scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
          if ((SchemeSymbol *)local_d8._0_8_ == (SchemeSymbol *)0x0) {
            lVar10 = 0;
          }
          else {
            lVar10 = __dynamic_cast(local_d8._0_8_,&SchemeObject::typeinfo,&SchemePair::typeinfo,0);
          }
          if (lVar10 == 0) {
            p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            lVar10 = 0;
          }
          else {
            p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_d8._8_8_ + 8) = *(_Atomic_word *)(local_d8._8_8_ + 8) + 1;
              }
            }
          }
          if (lVar10 == 0) {
            prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (prVar13,"unquote-slicing: the expression did not evaluate to a list");
            *(undefined ***)prVar13 = &PTR__runtime_error_0016b300;
            __cxa_throw(prVar13,&eval_error::typeinfo,std::runtime_error::~runtime_error);
          }
          p_Var11 = std::__cxx11::
                    list<std::shared_ptr<SchemeObject>,std::allocator<std::shared_ptr<SchemeObject>>>
                    ::_M_create_node<std::shared_ptr<SchemeObject>const&>
                              ((list<std::shared_ptr<SchemeObject>,std::allocator<std::shared_ptr<SchemeObject>>>
                                *)&local_a0,(shared_ptr<SchemeObject> *)(lVar10 + 8));
          std::__detail::_List_node_base::_M_hook(&p_Var11->super__List_node_base);
          local_a0.value.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)&(local_a0.value.
                           super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base + 1);
          local_d8._0_8_ = *(undefined8 *)(lVar10 + 0x18);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8),
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar10 + 0x20));
          if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
          }
        }
        pEVar16 = &local_a0;
        if (&local_a0 != (ExecutionResult *)local_a0._0_8_) {
          do {
            prepend_value((shared_ptr<SchemePair> *)&local_80,
                          (shared_ptr<SchemeObject> *)
                          ((pEVar16->value).
                           super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 2),
                          (bool *)local_b0._M_local_buf);
            iVar8 = iVar8 + 1;
            pEVar16 = (ExecutionResult *)
                      (pEVar16->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
          } while (pEVar16 != (ExecutionResult *)local_a0._0_8_);
        }
        std::__cxx11::
        _List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>::
        _M_clear((_List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                  *)&local_a0);
      }
      else {
        p_Var2 = p_Var14->_M_prev[1]._M_next;
        if ((*(int *)&p_Var2->_M_next == 1) &&
           (iVar9 = std::__cxx11::string::compare((char *)&p_Var2->_M_prev), iVar9 == 0)) {
          if (iVar8 != 1) {
            prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar13,"Invalid dotted sequence");
            *(undefined ***)prVar13 = &PTR__runtime_error_0016b300;
            __cxa_throw(prVar13,&eval_error::typeinfo,std::runtime_error::~runtime_error);
          }
          peVar3 = (((shared_ptr<SchemeObject> *)
                    ((long)local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 8))->
                   super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          p_Var15 = (((shared_ptr<SchemeObject> *)
                     ((long)local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 8))->
                    super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
          (((shared_ptr<SchemeObject> *)
           ((long)local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8))
          ->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               (((shared_ptr<SchemeObject> *)
                ((long)local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 0x18))->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          (((shared_ptr<SchemeObject> *)
           ((long)local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
           0x18))->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar3;
          p_Var4 = (((shared_ptr<SchemeObject> *)
                    ((long)local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 0x18))->
                   super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
          (((shared_ptr<SchemeObject> *)
           ((long)local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
           0x18))->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
               p_Var15;
          (((shared_ptr<SchemeObject> *)
           ((long)local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 8))
          ->super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var4
          ;
          local_b0._M_local_buf[0] = 1;
          iVar8 = 2;
        }
        else {
          prepend_value((shared_ptr<SchemePair> *)&local_80,(shared_ptr<SchemeObject> *)local_d8,
                        (bool *)local_b0._M_local_buf);
          iVar8 = iVar8 + 1;
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      }
      p_Var14 = p_Var14->_M_prev;
      peVar12 = (local_40->super___shared_ptr<ASTNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    } while (p_Var14 !=
             (peVar12->list).
             super__List_base<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>.
             _M_impl._M_node.super__List_node_base._M_next);
  }
  __return_storage_ptr__ = local_68;
  if (peVar12->type == VECTOR) {
    local_60.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_60.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    SchemeVector::from_list((SchemeVector *)local_d8,&local_60);
    uVar7 = local_d8._8_8_;
    uVar6 = local_d8._0_8_;
    local_d8._0_8_ = (SchemeSymbol *)0x0;
    local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar6;
      (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      __return_storage_ptr__->second = false;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(uVar7 + 8) = *(_Atomic_word *)(uVar7 + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(uVar7 + 8) = *(_Atomic_word *)(uVar7 + 8) + 1;
      }
      (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar6;
      (__return_storage_ptr__->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
      __return_storage_ptr__->second = false;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
      }
    }
    this_00._M_pi =
         local_60.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
      this_00._M_pi =
           local_60.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    }
LAB_00137859:
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
  }
  else {
    if (local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
      if (local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
        (local_68->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (local_68->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
        local_68->second = false;
        this_00._M_pi =
             local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        goto LAB_00137859;
      }
    }
    (local_68->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (local_68->first).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_68->second = false;
  }
LAB_001372d0:
  if (local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::shared_ptr<SchemeObject>, bool>
do_quote(std::shared_ptr<ASTNode> node, const Context &context, int quasi_level)
{
    if(node->type == ast_type_t::STRING || node->type == ast_type_t::INT || node->type == ast_type_t::FLOAT ||
       node->type == ast_type_t::BOOL || node->type == ast_type_t::CHAR)
    {
        return {node->evaluate(context).force_value(), false};
    }
    if(node->type == ast_type_t::NAME)
    {
        return {to_object(std::make_shared<SchemeSymbol>(node->value)), false};
    }
    auto lst = std::dynamic_pointer_cast<SchemePair>(scheme_nil);
    if(quasi_level > 0 && node->list.size() && node->list.front()->type == ast_type_t::NAME)
    {
        auto head = node->list.front()->value;
        if(head == "unquote")
        {
            if(quasi_level == 1)
            {
                if(node->list.size() != 2)
                    throw eval_error("unquote: one argument required");
                return {node->list.back()->evaluate(context).force_value(), false};
            }
            --quasi_level;
        }
        else if(head == "unquote-splicing")
        {
            if(quasi_level == 1)
            {
                if(node->list.size() != 2)
                    throw eval_error("unquote-splicing: one argument required");
                return {node->list.back()->evaluate(context).force_value(), true};
            }
            --quasi_level;
        }
        else if(head == "quasiquote")
            ++quasi_level;
    }
    int taken = 0;
    bool dotted = false;
    for(auto i = node->list.rbegin(); i != node->list.rend(); ++i)
    {
        auto quoted = do_quote(*i, context, quasi_level);
        if(quoted.second)
        {
            std::list<std::shared_ptr<SchemeObject>> to_insert;
            while(quoted.first != scheme_nil)
            {
                auto sublst = std::dynamic_pointer_cast<SchemePair>(quoted.first);
                if(!sublst)
                    throw eval_error("unquote-slicing: the expression did not evaluate to a list");
                to_insert.push_back(sublst->car);
                quoted.first = sublst->cdr;
            }
            for(auto j = to_insert.rbegin(); j != to_insert.rend(); ++j)
            {
                prepend_value(lst, *j, dotted);
                ++taken;
            }
        }
        else if((*i)->type == ast_type_t::NAME && (*i)->value == ".")
        {
            if(taken != 1)
                throw eval_error("Invalid dotted sequence");
            std::swap(lst->car, lst->cdr);
            dotted = true;
            ++taken;
        }
        else
        {
            prepend_value(lst, quoted.first, dotted);
            ++taken;
        }
    }
    if(node->type == ast_type_t::VECTOR)
        return {to_object(SchemeVector::from_list(lst)), false};
    return {to_object(lst), false};
}